

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

Vec_Str_t * Lms_GiaSuppSizes(Gia_Man_t *p)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  Vec_Str_t *p_00;
  Vec_Str_t *p_01;
  bool bVar5;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Vec_Str_t *vSupps;
  Vec_Str_t *vResult;
  Gia_Man_t *p_local;
  
  iVar3 = Gia_ManObjNum(p);
  p_00 = Vec_StrAlloc(iVar3);
  Vec_StrPush(p_00,'\0');
  local_2c = 1;
  while( true ) {
    bVar5 = false;
    if (local_2c < p->nObjs) {
      pGStack_28 = Gia_ManObj(p,local_2c);
      bVar5 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar3 = Gia_ObjIsAnd(pGStack_28);
    if (iVar3 == 0) {
      iVar3 = Gia_ObjIsCo(pGStack_28);
      if (iVar3 == 0) {
        iVar3 = Gia_ObjIsCi(pGStack_28);
        if (iVar3 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                        ,0xe7,"Vec_Str_t *Lms_GiaSuppSizes(Gia_Man_t *)");
        }
        iVar3 = Gia_ObjCioId(pGStack_28);
        Vec_StrPush(p_00,(char)iVar3 + '\x01');
      }
      else {
        iVar3 = Gia_ObjFaninId0(pGStack_28,local_2c);
        cVar2 = Vec_StrEntry(p_00,iVar3);
        Vec_StrPush(p_00,cVar2);
      }
    }
    else {
      iVar3 = Gia_ObjFaninId0(pGStack_28,local_2c);
      cVar2 = Vec_StrEntry(p_00,iVar3);
      iVar3 = Gia_ObjFaninId1(pGStack_28,local_2c);
      cVar1 = Vec_StrEntry(p_00,iVar3);
      iVar3 = Abc_MaxInt((int)cVar2,(int)cVar1);
      Vec_StrPush(p_00,(char)iVar3);
    }
    local_2c = local_2c + 1;
  }
  iVar3 = Vec_StrSize(p_00);
  iVar4 = Gia_ManObjNum(p);
  if (iVar3 != iVar4) {
    __assert_fail("Vec_StrSize(vSupps) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0xe9,"Vec_Str_t *Lms_GiaSuppSizes(Gia_Man_t *)");
  }
  iVar3 = Gia_ManCoNum(p);
  p_01 = Vec_StrAlloc(iVar3);
  local_2c = 0;
  while( true ) {
    iVar3 = Vec_IntSize(p->vCos);
    bVar5 = false;
    if (local_2c < iVar3) {
      pGStack_28 = Gia_ManCo(p,local_2c);
      bVar5 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar3 = Gia_ObjId(p,pGStack_28);
    cVar2 = Vec_StrEntry(p_00,iVar3);
    Vec_StrPush(p_01,cVar2);
    local_2c = local_2c + 1;
  }
  Vec_StrFree(p_00);
  return p_01;
}

Assistant:

Vec_Str_t * Lms_GiaSuppSizes( Gia_Man_t * p )
{
    Vec_Str_t * vResult;
    Vec_Str_t * vSupps;
    Gia_Obj_t * pObj;
    int i;
    vSupps = Vec_StrAlloc( Gia_ManObjNum(p) );
    Vec_StrPush( vSupps, 0 );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Vec_StrPush( vSupps, (char)Abc_MaxInt( Vec_StrEntry(vSupps, Gia_ObjFaninId0(pObj, i)), Vec_StrEntry(vSupps, Gia_ObjFaninId1(pObj, i)) ) );
        else if ( Gia_ObjIsCo(pObj) )
            Vec_StrPush( vSupps, Vec_StrEntry(vSupps, Gia_ObjFaninId0(pObj, i)) );
        else if ( Gia_ObjIsCi(pObj) )
            Vec_StrPush( vSupps, (char)(Gia_ObjCioId(pObj)+1) );
        else assert( 0 );
    }
    assert( Vec_StrSize(vSupps) == Gia_ManObjNum(p) );
    vResult = Vec_StrAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_StrPush( vResult, Vec_StrEntry(vSupps, Gia_ObjId(p, pObj)) );
    Vec_StrFree( vSupps );
    return vResult;
}